

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

aiReturn aiGetMaterialProperty
                   (aiMaterial *pMat,char *pKey,uint type,uint index,aiMaterialProperty **pPropOut)

{
  aiMaterialProperty **ppaVar1;
  int iVar2;
  aiReturn aVar3;
  ulong uVar4;
  ulong uVar5;
  aiMaterialProperty *paVar6;
  bool bVar7;
  bool bVar8;
  
  if (pMat == (aiMaterial *)0x0) {
    __assert_fail("pMat != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x41,
                  "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
                 );
  }
  if (pKey == (char *)0x0) {
    __assert_fail("pKey != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x42,
                  "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
                 );
  }
  if (pPropOut == (aiMaterialProperty **)0x0) {
    __assert_fail("pPropOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x43,
                  "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
                 );
  }
  uVar4 = (ulong)pMat->mNumProperties;
  bVar7 = uVar4 != 0;
  if (bVar7) {
    ppaVar1 = pMat->mProperties;
    uVar5 = 1;
    do {
      paVar6 = ppaVar1[uVar5 - 1];
      if ((((paVar6 != (aiMaterialProperty *)0x0) &&
           (iVar2 = strcmp((paVar6->mKey).data,pKey), iVar2 == 0)) &&
          ((type == 0xffffffff || (paVar6->mSemantic == type)))) &&
         ((index == 0xffffffff || (paVar6->mIndex == index)))) {
        aVar3 = aiReturn_SUCCESS;
        if (bVar7) goto LAB_0030c92c;
        break;
      }
      bVar7 = uVar5 < uVar4;
      bVar8 = uVar5 != uVar4;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  aVar3 = aiReturn_FAILURE;
  paVar6 = (aiMaterialProperty *)0x0;
LAB_0030c92c:
  *pPropOut = paVar6;
  return aVar3;
}

Assistant:

aiReturn aiGetMaterialProperty(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    const aiMaterialProperty** pPropOut)
{
    ai_assert( pMat != NULL );
    ai_assert( pKey != NULL );
    ai_assert( pPropOut != NULL );

    /*  Just search for a property with exactly this name ..
     *  could be improved by hashing, but it's possibly
     *  no worth the effort (we're bound to C structures,
     *  thus std::map or derivates are not applicable. */
    for ( unsigned int i = 0; i < pMat->mNumProperties; ++i ) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if (prop /* just for safety ... */
            && 0 == strcmp( prop->mKey.data, pKey )
            && (UINT_MAX == type  || prop->mSemantic == type) /* UINT_MAX is a wild-card, but this is undocumented :-) */
            && (UINT_MAX == index || prop->mIndex == index))
        {
            *pPropOut = pMat->mProperties[i];
            return AI_SUCCESS;
        }
    }
    *pPropOut = NULL;
    return AI_FAILURE;
}